

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::format
          (LocalizedNumberFormatterAsFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_208 [8];
  FieldPositionIteratorHandler fpih;
  undefined1 local_190 [8];
  UFormattedNumberData data;
  UErrorCode *status_local;
  FieldPositionIterator *posIter_local;
  UnicodeString *appendTo_local;
  Formattable *obj_local;
  LocalizedNumberFormatterAsFormat *this_local;
  
  data.string._248_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UFormattedNumberData::UFormattedNumberData((UFormattedNumberData *)local_190);
    Formattable::populateDecimalQuantity
              (obj,(DecimalQuantity *)&data,(UErrorCode *)data.string._248_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)data.string._248_8_);
    if (UVar1 == '\0') {
      LocalizedNumberFormatter::formatImpl
                (&this->fFormatter,(UFormattedNumberData *)local_190,
                 (UErrorCode *)data.string._248_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)data.string._248_8_);
      if (UVar1 == '\0') {
        NumberStringBuilder::toTempUnicodeString
                  ((UnicodeString *)&fpih.status,(NumberStringBuilder *)&data.quantity.usingBytes);
        UnicodeString::append(appendTo,(UnicodeString *)&fpih.status);
        UnicodeString::~UnicodeString((UnicodeString *)&fpih.status);
        if (posIter != (FieldPositionIterator *)0x0) {
          FieldPositionIteratorHandler::FieldPositionIteratorHandler
                    ((FieldPositionIteratorHandler *)local_208,posIter,
                     (UErrorCode *)data.string._248_8_);
          NumberStringBuilder::getAllFieldPositions
                    ((NumberStringBuilder *)&data.quantity.usingBytes,
                     (FieldPositionIteratorHandler *)local_208,(UErrorCode *)data.string._248_8_);
          FieldPositionIteratorHandler::~FieldPositionIteratorHandler
                    ((FieldPositionIteratorHandler *)local_208);
        }
      }
    }
    UFormattedNumberData::~UFormattedNumberData((UFormattedNumberData *)local_190);
  }
  return appendTo;
}

Assistant:

UnicodeString& LocalizedNumberFormatterAsFormat::format(const Formattable& obj, UnicodeString& appendTo,
                                                        FieldPositionIterator* posIter,
                                                        UErrorCode& status) const {
    if (U_FAILURE(status)) { return appendTo; }
    UFormattedNumberData data;
    obj.populateDecimalQuantity(data.quantity, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    fFormatter.formatImpl(&data, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    appendTo.append(data.string.toTempUnicodeString());
    if (posIter != nullptr) {
        FieldPositionIteratorHandler fpih(posIter, status);
        data.string.getAllFieldPositions(fpih, status);
    }
    return appendTo;
}